

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O3

void regress(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  size_t __size;
  int p;
  int iVar1;
  uint uVar2;
  double *anv;
  double *ci_lower;
  double *ci_upper;
  double *sigma2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long local_68;
  double *local_40;
  
  p = obj->p;
  lVar5 = (long)p;
  obj->alpha = alpha;
  anv = (double *)malloc(0x38);
  if (lVar5 == 0) {
    local_68 = 0;
    local_40 = (double *)0x0;
  }
  else {
    local_40 = (double *)malloc(lVar5 * 8);
    local_68 = lVar5;
  }
  __size = lVar5 * 8 + 8;
  ci_lower = (double *)malloc(__size);
  ci_upper = (double *)malloc(__size);
  sigma2 = (double *)malloc(8);
  linreg_multi(p,x,y,obj->N,local_40,sigma2,varcovar,obj->R2,res,alpha,anv,ci_lower,ci_upper,
               &obj->rank,obj->lls,obj->intercept);
  uVar2 = obj->N;
  obj->df = uVar2 - obj->p;
  obj->sigma = *sigma2;
  obj->sigma_lower = ci_lower[local_68];
  obj->sigma_upper = ci_upper[local_68];
  obj->TSS = *anv;
  obj->ESS = anv[1];
  obj->RSS = anv[2];
  obj->df_ESS = (int)anv[3];
  obj->df_RSS = (int)anv[4];
  obj->FStat = anv[5];
  obj->PVal = anv[6];
  obj->r2 = obj->R2[0];
  obj->r2adj = obj->R2[1];
  if (0 < p) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&obj->beta[0].value + lVar4 * 4) =
           *(undefined8 *)((long)local_40 + lVar4);
      *(undefined8 *)((long)&obj->beta[0].lower + lVar4 * 4) =
           *(undefined8 *)((long)ci_lower + lVar4);
      *(undefined8 *)((long)&obj->beta[0].upper + lVar4 * 4) =
           *(undefined8 *)((long)ci_upper + lVar4);
      dVar6 = *varcovar;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      *(double *)((long)&obj->beta[0].stdErr + lVar4 * 4) = dVar6;
      varcovar = varcovar + (lVar5 + 1U & 0xffffffff);
      lVar4 = lVar4 + 8;
    } while (lVar5 * 8 - lVar4 != 0);
    uVar2 = obj->N;
  }
  if ((int)uVar2 < 1) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      dVar6 = dVar6 + res[uVar3] * res[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  dVar8 = (double)(int)uVar2 * 0.5;
  dVar6 = log(dVar6 / (double)(int)uVar2);
  dVar8 = (dVar8 * -1.8378770664093453 - dVar6 * dVar8) - dVar8;
  obj->loglik = dVar8;
  iVar1 = obj->intercept;
  dVar6 = (double)p;
  dVar8 = dVar8 * -2.0;
  obj->aic = dVar6 + dVar6 + dVar8;
  dVar7 = log((double)obj->N);
  obj->bic = dVar7 * dVar6 + dVar8;
  dVar6 = (double)(int)(p - (uint)(iVar1 == 1));
  obj->aicc = ((double)obj->N / (((double)obj->N - dVar6) + -1.0) + -1.0) * (dVar6 + dVar6) +
              obj->aic;
  free(anv);
  free(local_40);
  free(ci_upper);
  free(ci_lower);
  free(sigma2);
  return;
}

Assistant:

void regress(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	double *anv2, *b2, *low, *up, *sigma2;
	int p, i, p2, k, dfm;
	double ssr, N2, pi;
	/*
	* obj - Regression object created by reg_init
	*  x - Vector containing (p - 1 ) independent regression variables of length N each
	*  y - Vector containing dependent regression variable of length N
	*  res - Residual vector of length N
	* varcovar - Variance-Covariance Matrix of p regression parameters. Dimension p X p
	* alpha is used to determine confidence interval limits
	* for a given 100*(1-alpha) % confidence interval
	* eg., alpha = 0.05 if you want to determine 95% confidence interval values
	*/
	p = obj->p;
	obj->alpha = alpha;
	anv2 = (double*)malloc(sizeof(double) * 7);
	b2 = p == 0 ? NULL : (double*)malloc(sizeof(double) * p);
	low = (double*)malloc(sizeof(double) * (p + 1));
	up = (double*)malloc(sizeof(double) * (p + 1));
	sigma2 = (double*)malloc(sizeof(double) * 1);

	pi = 3.141592653589793;


	linreg_multi(p, x, y, obj->N, b2, sigma2, varcovar,
		obj->R2, res, alpha, anv2, low, up, &obj->rank, obj->lls, obj->intercept);
	obj->df = obj->N - obj->p;

	obj->sigma = sigma2[0];
	obj->sigma_lower = low[p];
	obj->sigma_upper = up[p];

	obj->TSS = anv2[0];
	obj->ESS = anv2[1];
	obj->RSS = anv2[2];
	obj->df_ESS = (int)anv2[3];
	obj->df_RSS = (int)anv2[4];
	obj->FStat = anv2[5];
	obj->PVal = anv2[6];
	obj->r2 = obj->R2[0];
	obj->r2adj = obj->R2[1];

	for (i = 0; i < p; ++i) {
		(obj->beta + i)->value = b2[i];
		(obj->beta + i)->lower = low[i];
		(obj->beta + i)->upper = up[i];
		(obj->beta + i)->stdErr = sqrt(varcovar[(p + 1)*i]);
	}

	// Log Likelihood

	N2 = (double)(obj->N) / 2.0;

	ssr = 0.0;

	for (i = 0; i < obj->N; ++i) {
		ssr += (res[i] * res[i]);
	}

	obj->loglik = -N2 * log(2 * pi) - N2 * log(ssr / (double)obj->N) - N2;

	k = obj->intercept == 1 ? 1 : 0;
	dfm = obj->intercept == 1 ? p - 1 : p;

	obj->aic = -2.0 * obj->loglik + 2.0 * (double)(k + dfm);
	obj->bic = -2.0 * obj->loglik + log((double)obj->N) * (double)(k + dfm);
	obj->aicc = obj->aic + 2.0 * dfm * ((double)obj->N / ((double)obj->N - dfm - 1.0) - 1.0);

	free(anv2);
	free(b2);
	free(up);
	free(low);
	free(sigma2);
}